

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

bool jsonip::parser::cirange_<(char)48,(char)57>::
     match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::IStreamReader>>
               (ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader> *state)

{
  istream *piVar1;
  char cVar2;
  
  piVar1 = state->reader_->in_;
  if ((*(int *)(piVar1 + *(long *)(*(long *)piVar1 + -0x18) + 0x20) == 0) &&
     (cVar2 = ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::char_at_pos(state)
     , (byte)(cVar2 - 0x30U) < 10)) {
    ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::advance(state);
    return true;
  }
  return false;
}

Assistant:

static inline bool match(S& state)
        {
            if (state.at_end()) return false;

            char c = state.char_at_pos();
            if (c >= c1 && c <= c2)
            {
                state.advance();
                return true;
            }
            return false;
        }